

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandRunTest(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  char *pcVar2;
  uint local_54;
  uint local_50;
  int fVerbose;
  int fFancy;
  int c;
  char *pFileNames [4];
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pFileNames[3] = (char *)argv;
  memset(&fFancy,0,0x20);
  local_50 = 0;
  local_54 = 0;
  Extra_UtilGetoptReset();
  while (iVar1 = Extra_UtilGetopt(argc,(char **)pFileNames[3],"fvh"), iVar1 != -1) {
    if (iVar1 == 0x66) {
      local_50 = local_50 ^ 1;
    }
    else {
      if ((iVar1 == 0x68) || (iVar1 != 0x76)) goto LAB_0026ed8d;
      local_54 = local_54 ^ 1;
    }
  }
  if ((argc - globalUtilOptind < 2) || (5 < argc - globalUtilOptind)) {
    Abc_Print(1,"Expecting two or three file names on the command line.\n");
LAB_0026ed8d:
    Abc_Print(-2,"usage: runtest [-fvh] <file1> <file2>\n");
    Abc_Print(-2,"\t           experimental simulation command\n");
    pcVar2 = "no";
    if (local_50 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-f       : toggle using experimental feature [default = %s]\n",pcVar2);
    pcVar2 = "no";
    if (local_54 != 0) {
      pcVar2 = "yes";
    }
    Abc_Print(-2,"\t-v       : toggle printing verbose information [default = %s]\n",pcVar2);
    Abc_Print(-2,"\t-h       : print the command usage\n");
    pAbc_local._4_4_ = 1;
  }
  else {
    for (fVerbose = 0; fVerbose < argc - globalUtilOptind; fVerbose = fVerbose + 1) {
      *(undefined8 *)(&fFancy + (long)fVerbose * 2) =
           *(undefined8 *)(pFileNames[3] + (long)(globalUtilOptind + fVerbose) * 8);
    }
    Acb_NtkRunTest((char **)&fFancy,local_50,local_54);
    pAbc_local._4_4_ = 0;
  }
  return pAbc_local._4_4_;
}

Assistant:

int Abc_CommandRunTest( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Acb_NtkRunTest( char * pFileNames[4], int fFancy, int fVerbose );
    char * pFileNames[4] = {NULL};
    int c, fFancy = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "fvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'f':
            fFancy ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( argc - globalUtilOptind < 2 || argc - globalUtilOptind > 5 )
    {
        Abc_Print( 1, "Expecting two or three file names on the command line.\n" );
        goto usage;
    }
    for ( c = 0; c < argc - globalUtilOptind; c++ )
        pFileNames[c] = argv[globalUtilOptind+c];
    Acb_NtkRunTest( pFileNames, fFancy, fVerbose );
    return 0;

usage:
    Abc_Print( -2, "usage: runtest [-fvh] <file1> <file2>\n" );
    Abc_Print( -2, "\t           experimental simulation command\n" );
    Abc_Print( -2, "\t-f       : toggle using experimental feature [default = %s]\n",      fFancy? "yes": "no" );
    Abc_Print( -2, "\t-v       : toggle printing verbose information [default = %s]\n",    fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}